

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

ostream * glu::TextureTestUtil::operator<<(ostream *str,LogGradientFmt *fmt)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"(R: ",4);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMin->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMax->m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"G: ",3);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMin->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMax->m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"B: ",3);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMin->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMax->m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"A: ",3);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMin->m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," -> ",4);
  poVar1 = std::ostream::_M_insert<double>((double)fmt->valueMax->m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const LogGradientFmt& fmt)
{
	return str << "(R: " << fmt.valueMin->x() << " -> " << fmt.valueMax->x() << ", "
			   <<  "G: " << fmt.valueMin->y() << " -> " << fmt.valueMax->y() << ", "
			   <<  "B: " << fmt.valueMin->z() << " -> " << fmt.valueMax->z() << ", "
			   <<  "A: " << fmt.valueMin->w() << " -> " << fmt.valueMax->w() << ")";
}